

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void highbd_build_mc_border
               (uint8_t *src8,int src_stride,uint8_t *dst8,int dst_stride,int x,int y,int b_w,
               int b_h,int w,int h)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int left;
  int copy;
  int right;
  uint16_t *ref_row;
  uint16_t *dst;
  uint16_t *src;
  int local_50;
  int local_4c;
  int local_44;
  ushort *local_40;
  void *local_38;
  int local_24;
  
  local_38 = (void *)(in_RDX << 1);
  local_40 = (ushort *)(in_RDI * 2 + (long)in_R8D * -2 + (long)(in_R9D * in_ESI) * -2);
  local_24 = in_R9D;
  if (in_R9D < (int)dst) {
    if (0 < in_R9D) {
      local_40 = local_40 + in_R9D * in_ESI;
    }
  }
  else {
    local_40 = local_40 + ((int)dst + -1) * in_ESI;
  }
  do {
    local_44 = 0;
    if (in_R8D < 0) {
      local_50 = -in_R8D;
    }
    else {
      local_50 = 0;
    }
    local_4c = local_50;
    if (in_stack_00000008 < local_50) {
      local_4c = in_stack_00000008;
    }
    if ((int)ref_row < in_R8D + in_stack_00000008) {
      local_44 = (in_R8D + in_stack_00000008) - (int)ref_row;
    }
    if (in_stack_00000008 < local_44) {
      local_44 = in_stack_00000008;
    }
    iVar1 = (in_stack_00000008 - local_4c) - local_44;
    if (local_4c != 0) {
      aom_memset16(local_38,(uint)*local_40,(long)local_4c);
    }
    if (iVar1 != 0) {
      memcpy((void *)((long)local_38 + (long)local_4c * 2),local_40 + (long)in_R8D + (long)local_4c,
             (long)iVar1 << 1);
    }
    if (local_44 != 0) {
      aom_memset16((void *)((long)local_38 + (long)iVar1 * 2 + (long)local_4c * 2),
                   (uint)local_40[(int)ref_row + -1],(long)local_44);
    }
    local_38 = (void *)((long)local_38 + (long)in_ECX * 2);
    local_24 = local_24 + 1;
    if ((0 < local_24) && (local_24 < (int)dst)) {
      local_40 = local_40 + in_ESI;
    }
    copy = copy + -1;
  } while (copy != 0);
  return;
}

Assistant:

static inline void highbd_build_mc_border(const uint8_t *src8, int src_stride,
                                          uint8_t *dst8, int dst_stride, int x,
                                          int y, int b_w, int b_h, int w,
                                          int h) {
  // Get a pointer to the start of the real data for this row.
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst8);
  const uint16_t *ref_row = src - x - y * src_stride;

  if (y >= h)
    ref_row += (h - 1) * src_stride;
  else if (y > 0)
    ref_row += y * src_stride;

  do {
    int right = 0, copy;
    int left = x < 0 ? -x : 0;

    if (left > b_w) left = b_w;

    if (x + b_w > w) right = x + b_w - w;

    if (right > b_w) right = b_w;

    copy = b_w - left - right;

    if (left) aom_memset16(dst, ref_row[0], left);

    if (copy) memcpy(dst + left, ref_row + x + left, copy * sizeof(uint16_t));

    if (right) aom_memset16(dst + left + copy, ref_row[w - 1], right);

    dst += dst_stride;
    ++y;

    if (y > 0 && y < h) ref_row += src_stride;
  } while (--b_h);
}